

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

void Emb_ManComputeEigenvectors(Emb_Man_t *p,int nDims,int nSols)

{
  float *pVec;
  float *pfVar1;
  float **ppfVar2;
  float *pfVar3;
  int i_1;
  uint uVar4;
  int k_1;
  int i;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  float Res_1;
  float Res;
  float fVar11;
  
  if (nSols < nDims) {
    if (0 < nSols) {
      pVec = p->pEigen[nSols];
      uVar9 = (ulong)(uint)nDims;
      uVar6 = 0;
      do {
        pfVar1 = p->pEigen[uVar6];
        uVar5 = 0;
        do {
          uVar4 = Gia_ManRandom(0);
          pVec[uVar5] = (float)uVar4;
          uVar5 = uVar5 + 1;
        } while (uVar9 != uVar5);
        Emb_ManVecNormal(pVec,nDims);
        uVar4 = 0;
        do {
          uVar5 = 0;
          do {
            pfVar1[uVar5] = pVec[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar9 != uVar5);
          if (uVar6 != 0) {
            ppfVar2 = p->pEigen;
            uVar5 = 0;
            do {
              pfVar3 = ppfVar2[uVar5];
              uVar7 = 0;
              do {
                fVar11 = 0.0;
                uVar8 = 0;
                do {
                  fVar11 = fVar11 + pfVar1[uVar8] * pfVar3[uVar8];
                  uVar8 = uVar8 + 1;
                } while (uVar9 != uVar8);
                pVec[uVar7] = pfVar1[uVar7] - pfVar3[uVar7] * fVar11;
                uVar7 = uVar7 + 1;
              } while (uVar7 != uVar9);
              uVar7 = 0;
              do {
                pfVar1[uVar7] = pVec[uVar7];
                uVar7 = uVar7 + 1;
              } while (uVar9 != uVar7);
              uVar5 = uVar5 + 1;
            } while (uVar5 != uVar6);
          }
          ppfVar2 = p->pMatr;
          uVar5 = 0;
          do {
            fVar11 = 0.0;
            uVar7 = 0;
            do {
              fVar11 = fVar11 + ppfVar2[uVar5][uVar7] * pfVar1[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar9 != uVar7);
            pVec[uVar5] = fVar11;
            uVar5 = uVar5 + 1;
          } while (uVar5 != uVar9);
          Emb_ManVecNormal(pVec,nDims);
          fVar11 = 0.0;
          uVar5 = 0;
          do {
            fVar11 = fVar11 + pVec[uVar5] * pfVar1[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar9 != uVar5);
        } while ((fVar11 < 0.999) && (bVar10 = uVar4 < 99, uVar4 = uVar4 + 1, bVar10));
        uVar5 = 0;
        do {
          pfVar1[uVar5] = pVec[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar9 != uVar5);
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uint)nSols);
    }
    return;
  }
  __assert_fail("nSols < nDims",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                ,0x552,"void Emb_ManComputeEigenvectors(Emb_Man_t *, int, int)");
}

Assistant:

void Emb_ManComputeEigenvectors( Emb_Man_t * p, int nDims, int nSols )
{
    float * pVecUiHat, * pVecUi;
    int i, j, k;
    assert( nSols < nDims );
    pVecUiHat = p->pEigen[nSols];
    for ( i = 0; i < nSols; i++ )
    {
        pVecUi = p->pEigen[i];
        Emb_ManVecRandom( pVecUiHat, nDims );
        Emb_ManVecNormal( pVecUiHat, nDims );
        k = 0;
        do {
            k++;
            Emb_ManVecCopyOne( pVecUi, pVecUiHat, nDims );
            for ( j = 0; j < i; j++ )
            {
                Emb_ManVecOrthogonolizeOne( p->pEigen[j], pVecUi, nDims, pVecUiHat );
                Emb_ManVecCopyOne( pVecUi, pVecUiHat, nDims );
            }
            Emb_ManVecMultiply( p->pMatr, pVecUi, nDims, pVecUiHat );
            Emb_ManVecNormal( pVecUiHat, nDims );
        } while ( Emb_ManVecMultiplyOne( pVecUiHat, pVecUi, nDims ) < 0.999 && k < 100 );
        Emb_ManVecCopyOne( pVecUi, pVecUiHat, nDims );
//        printf( "Converged after %d iterations.\n", k );
    }
}